

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float *pfVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  void *pvVar11;
  long lVar12;
  float fVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar14;
  binary_op_pow op;
  __m128 _p1;
  __m128 _p;
  binary_op_pow local_a5;
  int local_a4;
  void *local_a0;
  Mat *local_98;
  ulong local_90;
  float local_88 [2];
  float afStack_80 [2];
  float local_78 [2];
  float afStack_70 [2];
  long local_68;
  long local_60;
  long local_58;
  void *local_50;
  Mat *local_48;
  Mat *local_40;
  ulong local_38;
  
  local_90 = (ulong)(uint)a->c;
  local_a4 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar4 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)local_90) {
      local_38 = 0;
      local_98 = a;
      local_48 = b;
      local_40 = c;
      do {
        pvVar9 = a->data;
        local_a0 = (void *)a->elemsize;
        pvVar11 = local_48->data;
        pvVar2 = local_40->data;
        if (local_a4 < 4) {
          pvVar9 = (void *)((long)pvVar9 + a->cstep * local_38 * (long)local_a0);
          pvVar11 = (void *)((long)pvVar11 + local_48->cstep * local_38 * local_48->elemsize);
          lVar5 = local_40->cstep * local_38 * local_40->elemsize;
          iVar4 = 0;
        }
        else {
          lVar5 = local_40->cstep * local_40->elemsize * local_38;
          lVar7 = local_48->cstep * local_48->elemsize * local_38;
          lVar12 = a->cstep * (long)local_a0 * local_38;
          lVar8 = 0;
          iVar6 = 0;
          local_a0 = pvVar9;
          local_68 = lVar5;
          local_60 = lVar7;
          local_58 = lVar12;
          local_50 = pvVar11;
          do {
            pfVar1 = (float *)((long)pvVar9 + lVar8 + lVar12);
            local_78 = *(float (*) [2])pfVar1;
            afStack_70 = *(float (*) [2])(pfVar1 + 2);
            pfVar1 = (float *)((long)pvVar11 + lVar8 + lVar7);
            local_88 = *(float (*) [2])pfVar1;
            afStack_80 = *(float (*) [2])(pfVar1 + 2);
            afVar14 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                (&local_a5,(__m128 *)local_78,(__m128 *)local_88);
            auVar3._8_4_ = extraout_XMM0_Dc;
            auVar3._0_8_ = afVar14._0_8_;
            auVar3._12_4_ = extraout_XMM0_Dd;
            *(undefined1 (*) [16])((long)pvVar2 + lVar8 + lVar5) = auVar3;
            iVar4 = iVar6 + 4;
            iVar10 = iVar6 + 7;
            lVar8 = lVar8 + 0x10;
            iVar6 = iVar4;
          } while (iVar10 < local_a4);
          lVar5 = local_68 + lVar8;
          pvVar11 = (void *)((long)local_50 + local_60 + lVar8);
          pvVar9 = (void *)((long)local_a0 + local_58 + lVar8);
        }
        a = local_98;
        iVar6 = local_a4 - iVar4;
        if (iVar4 < local_a4) {
          lVar7 = 0;
          do {
            fVar13 = powf(*(float *)((long)pvVar9 + lVar7 * 4),*(float *)((long)pvVar11 + lVar7 * 4)
                         );
            *(float *)((long)pvVar2 + lVar7 * 4 + lVar5) = fVar13;
            lVar7 = lVar7 + 1;
          } while (iVar6 != (int)lVar7);
        }
        local_38 = local_38 + 1;
      } while (local_38 != local_90);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}